

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O3

void unpackforblock22(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t *puVar13;
  uint uVar14;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  puVar13 = *pout;
  *pw = (uint8_t *)(puVar1 + 0xb);
  puVar13[4] = ((uint)(uVar3 >> 0x18) & 0x3fffff) + base;
  puVar13[5] = ((uint)(uVar4 << 0x12) & 0x3fffff | (uint)(uVar3 >> 0x2e)) + base;
  puVar13[6] = ((uint)(uVar4 >> 4) & 0x3fffff) + base;
  puVar13[7] = ((uint)(uVar4 >> 0x1a) & 0x3fffff) + base;
  *puVar13 = ((uint)uVar2 & 0x3fffff) + base;
  puVar13[1] = ((uint)(uVar2 >> 0x16) & 0x3fffff) + base;
  puVar13[2] = ((uint)(uVar2 >> 0x2c) | (uint)(uVar3 << 0x14) & 0x3fffff) + base;
  puVar13[3] = ((uint)(uVar3 >> 2) & 0x3fffff) + base;
  puVar13[8] = ((uint)(ushort)(uVar4 >> 0x30) | (uint)(uVar5 << 0x10) & 0x3fffff) + base;
  puVar13[9] = ((uint)(uVar5 >> 6) & 0x3fffff) + base;
  puVar13[10] = ((uint)(uVar5 >> 0x1c) & 0x3fffff) + base;
  puVar13[0xb] = ((uint)(uVar6 << 0xe) & 0x3fffff | (uint)(uVar5 >> 0x32)) + base;
  puVar13[0xc] = ((uint)(uVar6 >> 8) & 0x3fffff) + base;
  puVar13[0xd] = ((uint)(uVar6 >> 0x1e) & 0x3fffff) + base;
  puVar13[0xe] = ((uint)(uVar7 << 0xc) & 0x3fffff | (uint)(uVar6 >> 0x34)) + base;
  puVar13[0xf] = ((uint)(uVar7 >> 10) & 0x3fffff) + base;
  uVar14 = (uint)(uVar7 >> 0x20);
  puVar13[0x10] = (uVar14 & 0x3fffff) + base;
  puVar13[0x11] = ((uint)(uVar8 << 10) & 0x3fffff | uVar14 >> 0x16) + base;
  puVar13[0x12] = ((uint)(uVar8 >> 0xc) & 0x3fffff) + base;
  puVar13[0x13] = ((uint)(uVar8 >> 0x22) & 0x3fffff) + base;
  puVar13[0x14] = ((uint)(uVar9 << 8) & 0x3fffff | (uint)(byte)(uVar8 >> 0x38)) + base;
  puVar13[0x15] = ((uint)(uVar9 >> 0xe) & 0x3fffff) + base;
  uVar14 = (uint)(uVar9 >> 0x20);
  puVar13[0x16] = (uVar14 >> 4 & 0x3fffff) + base;
  puVar13[0x17] = ((uint)(uVar10 << 6) & 0x3fffff | uVar14 >> 0x1a) + base;
  puVar13[0x18] = ((uint)(uVar10 >> 0x10) & 0x3fffff) + base;
  uVar14 = (uint)(uVar10 >> 0x20);
  puVar13[0x19] = (uVar14 >> 6 & 0x3fffff) + base;
  puVar13[0x1a] = ((uint)(uVar11 << 4) & 0x3fffff | uVar14 >> 0x1c) + base;
  puVar13[0x1b] = ((uint)(uVar11 >> 0x12) & 0x3fffff) + base;
  uVar14 = (uint)(uVar11 >> 0x20);
  puVar13[0x1c] = (uVar14 >> 8 & 0x3fffff) + base;
  puVar13[0x1d] = ((uint)(uVar12 << 2) & 0x3fffff | uVar14 >> 0x1e) + base;
  puVar13[0x1e] = ((uint)(uVar12 >> 0x14) & 0x3fffff) + base;
  puVar13[0x1f] = (uint)(uVar12 >> 0x2a) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock22(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(4194303);
  /* we are going to access  11 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  *pw += 88; /* we used up 88 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 22) & mask);
  out[2] = base + (uint32_t)(((w0 >> 44) | (w1 << 20)) & mask);
  out[3] = base + (uint32_t)((w1 >> 2) & mask);
  out[4] = base + (uint32_t)((w1 >> 24) & mask);
  out[5] = base + (uint32_t)(((w1 >> 46) | (w2 << 18)) & mask);
  out[6] = base + (uint32_t)((w2 >> 4) & mask);
  out[7] = base + (uint32_t)((w2 >> 26) & mask);
  out[8] = base + (uint32_t)(((w2 >> 48) | (w3 << 16)) & mask);
  out[9] = base + (uint32_t)((w3 >> 6) & mask);
  out[10] = base + (uint32_t)((w3 >> 28) & mask);
  out[11] = base + (uint32_t)(((w3 >> 50) | (w4 << 14)) & mask);
  out[12] = base + (uint32_t)((w4 >> 8) & mask);
  out[13] = base + (uint32_t)((w4 >> 30) & mask);
  out[14] = base + (uint32_t)(((w4 >> 52) | (w5 << 12)) & mask);
  out[15] = base + (uint32_t)((w5 >> 10) & mask);
  out[16] = base + (uint32_t)((w5 >> 32) & mask);
  out[17] = base + (uint32_t)(((w5 >> 54) | (w6 << 10)) & mask);
  out[18] = base + (uint32_t)((w6 >> 12) & mask);
  out[19] = base + (uint32_t)((w6 >> 34) & mask);
  out[20] = base + (uint32_t)(((w6 >> 56) | (w7 << 8)) & mask);
  out[21] = base + (uint32_t)((w7 >> 14) & mask);
  out[22] = base + (uint32_t)((w7 >> 36) & mask);
  out[23] = base + (uint32_t)(((w7 >> 58) | (w8 << 6)) & mask);
  out[24] = base + (uint32_t)((w8 >> 16) & mask);
  out[25] = base + (uint32_t)((w8 >> 38) & mask);
  out[26] = base + (uint32_t)(((w8 >> 60) | (w9 << 4)) & mask);
  out[27] = base + (uint32_t)((w9 >> 18) & mask);
  out[28] = base + (uint32_t)((w9 >> 40) & mask);
  out[29] = base + (uint32_t)(((w9 >> 62) | (w10 << 2)) & mask);
  out[30] = base + (uint32_t)((w10 >> 20) & mask);
  out[31] = base + (uint32_t)(w10 >> 42);
  *pout += 32; /* we wrote 32 32-bit integers */
}